

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

void normalizeFloat128Subnormal
               (uint64_t aSig0,uint64_t aSig1,int32_t *zExpPtr,uint64_t *zSig0Ptr,uint64_t *zSig1Ptr
               )

{
  byte bVar1;
  char cVar2;
  int iVar3;
  int8_t shiftCount;
  uint64_t *zSig1Ptr_local;
  uint64_t *zSig0Ptr_local;
  int32_t *zExpPtr_local;
  uint64_t aSig1_local;
  uint64_t aSig0_local;
  
  if (aSig0 == 0) {
    iVar3 = clz64(aSig1);
    bVar1 = (char)iVar3 - 0xf;
    if ((char)bVar1 < '\0') {
      *zSig0Ptr = aSig1 >> (-bVar1 & 0x3f);
      *zSig1Ptr = aSig1 << (bVar1 & 0x3f);
    }
    else {
      *zSig0Ptr = aSig1 << (bVar1 & 0x3f);
      *zSig1Ptr = 0;
    }
    *zExpPtr = -0x3f - (char)bVar1;
  }
  else {
    iVar3 = clz64(aSig0);
    cVar2 = (char)iVar3 + -0xf;
    shortShift128Left(aSig0,aSig1,(int)cVar2,zSig0Ptr,zSig1Ptr);
    *zExpPtr = 1 - cVar2;
  }
  return;
}

Assistant:

static void
 normalizeFloat128Subnormal(
     uint64_t aSig0,
     uint64_t aSig1,
     int32_t *zExpPtr,
     uint64_t *zSig0Ptr,
     uint64_t *zSig1Ptr
 )
{
    int8_t shiftCount;

    if ( aSig0 == 0 ) {
        shiftCount = clz64(aSig1) - 15;
        if ( shiftCount < 0 ) {
            *zSig0Ptr = aSig1>>( - shiftCount );
            *zSig1Ptr = aSig1<<( shiftCount & 63 );
        }
        else {
            *zSig0Ptr = aSig1<<shiftCount;
            *zSig1Ptr = 0;
        }
        *zExpPtr = - shiftCount - 63;
    }
    else {
        shiftCount = clz64(aSig0) - 15;
        shortShift128Left( aSig0, aSig1, shiftCount, zSig0Ptr, zSig1Ptr );
        *zExpPtr = 1 - shiftCount;
    }

}